

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::~Exception(Exception *this)

{
  Own<kj::Exception::Context>::dispose(&(this->context).ptr);
  Array<char>::~Array(&(this->description).content);
  Array<char>::~Array((Array<char> *)this);
  return;
}

Assistant:

Exception::~Exception() noexcept {}